

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::
ContainerEqMatcher<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>
::
MatchAndExplain<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>
          (ContainerEqMatcher<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>
           *this,vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                 *lhs,MatchResultListener *listener)

{
  internal_fixup *__last1;
  ostream *os;
  bool bVar1;
  __normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>
  _Var2;
  bool bVar3;
  pointer elem;
  char *pcVar4;
  internal_fixup *piVar5;
  
  piVar5 = (lhs->
           super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __last1 = (lhs->
            super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if ((long)__last1 - (long)piVar5 == *(long *)(this + 8) - (long)*(internal_fixup **)this) {
    bVar1 = std::__equal<false>::
            equal<pstore::repo::internal_fixup_const*,pstore::repo::internal_fixup_const*>
                      (piVar5,__last1,*(internal_fixup **)this);
  }
  else {
    bVar1 = false;
  }
  if ((bVar1 == false) && (os = listener->stream_, os != (ostream *)0x0)) {
    elem = (lhs->
           super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
           )._M_impl.super__Vector_impl_data._M_start;
    if (elem == (lhs->
                super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
      pcVar4 = "which";
    }
    else {
      bVar3 = false;
      do {
        _Var2 = ArrayAwareFind<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,pstore::repo::internal_fixup>
                          (*(internal_fixup **)this,*(internal_fixup **)(this + 8),elem);
        if (_Var2._M_current == *(internal_fixup **)(this + 8)) {
          if (bVar3) {
            std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      (os,"which has these unexpected elements: ",0x25);
            bVar3 = true;
          }
          pstore::repo::operator<<(os,elem);
        }
        elem = elem + 1;
      } while (elem != (lhs->
                       super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
      pcVar4 = "which";
      if (bVar3) {
        pcVar4 = ",\nand";
      }
    }
    piVar5 = *(internal_fixup **)this;
    if (piVar5 != *(internal_fixup **)(this + 8)) {
      bVar3 = false;
      do {
        _Var2 = ArrayAwareFind<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,pstore::repo::internal_fixup>
                          ((lhs->
                           super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                           )._M_impl.super__Vector_impl_data._M_start,
                           (lhs->
                           super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                           )._M_impl.super__Vector_impl_data._M_finish,piVar5);
        if (_Var2._M_current ==
            (lhs->
            super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          if (bVar3) {
            std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (os," doesn\'t have these expected elements: ",0x27);
            bVar3 = true;
          }
          pstore::repo::operator<<(os,piVar5);
        }
        piVar5 = piVar5 + 1;
      } while (piVar5 != *(internal_fixup **)(this + 8));
    }
  }
  return bVar1;
}

Assistant:

bool MatchAndExplain(const LhsContainer& lhs,
                       MatchResultListener* listener) const {
    typedef internal::StlContainerView<
        typename std::remove_const<LhsContainer>::type>
        LhsView;
    typedef typename LhsView::type LhsStlContainer;
    StlContainerReference lhs_stl_container = LhsView::ConstReference(lhs);
    if (lhs_stl_container == expected_)
      return true;

    ::std::ostream* const os = listener->stream();
    if (os != nullptr) {
      // Something is different. Check for extra values first.
      bool printed_header = false;
      for (typename LhsStlContainer::const_iterator it =
               lhs_stl_container.begin();
           it != lhs_stl_container.end(); ++it) {
        if (internal::ArrayAwareFind(expected_.begin(), expected_.end(), *it) ==
            expected_.end()) {
          if (printed_header) {
            *os << ", ";
          } else {
            *os << "which has these unexpected elements: ";
            printed_header = true;
          }
          UniversalPrint(*it, os);
        }
      }

      // Now check for missing values.
      bool printed_header2 = false;
      for (typename StlContainer::const_iterator it = expected_.begin();
           it != expected_.end(); ++it) {
        if (internal::ArrayAwareFind(
                lhs_stl_container.begin(), lhs_stl_container.end(), *it) ==
            lhs_stl_container.end()) {
          if (printed_header2) {
            *os << ", ";
          } else {
            *os << (printed_header ? ",\nand" : "which")
                << " doesn't have these expected elements: ";
            printed_header2 = true;
          }
          UniversalPrint(*it, os);
        }
      }
    }

    return false;
  }